

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O2

void memory_tree_ns::route_to_leaf
               (memory_tree *b,single_learner *base,uint32_t *ec_array_index,uint32_t cn,
               v_array<unsigned_int> *path,bool insertion)

{
  int iVar1;
  example *ec;
  node *pnVar2;
  bool bVar3;
  uint32_t *puVar4;
  uint32_t local_a8;
  float local_a4;
  polyprediction *local_a0;
  label_t *local_98;
  single_learner *local_90;
  label_t local_88;
  uint32_t *local_80;
  labels preds;
  labels multilabels;
  
  ec = (b->examples)._begin[*ec_array_index];
  local_98 = (label_t *)&ec->l;
  local_a0 = &ec->pred;
  if (b->oas == 0) {
    local_88 = *local_98;
    local_a4 = local_a0->scalar;
  }
  else {
    multilabels.label_v._begin = (((labels *)local_98)->label_v)._begin;
    multilabels.label_v._end = (ec->l).multilabels.label_v._end;
    multilabels.label_v.end_array = (ec->l).multilabels.label_v.end_array;
    multilabels.label_v.erase_count = (ec->l).cs.costs.erase_count;
    preds.label_v._begin = (local_a0->multilabels).label_v._begin;
    preds.label_v._end = (ec->pred).multilabels.label_v._end;
    preds.label_v.end_array = (ec->pred).multilabels.label_v.end_array;
    preds.label_v.erase_count = (ec->pred).scalars.erase_count;
    local_a4 = 0.0;
  }
  local_a8 = cn;
  local_90 = base;
  local_80 = ec_array_index;
  v_array<unsigned_int>::clear(path);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  while( true ) {
    iVar1 = (b->nodes)._begin[cn].internal;
    v_array<unsigned_int>::push_back(path,&local_a8);
    if (iVar1 == -1) break;
    LEARNER::learner<char,_example>::predict
              (local_90,ec,(ulong)(b->nodes)._begin[local_a8].base_router);
    if (insertion) {
      pnVar2 = (b->nodes)._begin;
      bVar3 = 0.0 <= (ec->pred).scalar;
      (&pnVar2[local_a8].nl)[bVar3] = (&pnVar2[local_a8].nl)[bVar3] + 1.0;
      puVar4 = &pnVar2[local_a8].left + bVar3;
    }
    else {
      pnVar2 = (b->nodes)._begin;
      if (0.0 <= (ec->pred).scalar) {
        puVar4 = &pnVar2[local_a8].right;
      }
      else {
        puVar4 = &pnVar2[local_a8].left;
      }
    }
    cn = *puVar4;
    local_a8 = cn;
  }
  if (b->oas == 0) {
    *local_98 = local_88;
    local_a0->scalar = local_a4;
  }
  else {
    (local_a0->multilabels).label_v.end_array = preds.label_v.end_array;
    (local_a0->scalars).erase_count = preds.label_v.erase_count;
    (local_a0->multilabels).label_v._begin = preds.label_v._begin;
    (local_a0->multilabels).label_v._end = preds.label_v._end;
    local_98[2] = (label_t)multilabels.label_v.end_array;
    local_98[3].label = (undefined4)multilabels.label_v.erase_count;
    local_98[3].weight = (float)multilabels.label_v.erase_count._4_4_;
    *local_98 = (label_t)multilabels.label_v._begin;
    local_98[1] = (label_t)multilabels.label_v._end;
  }
  if (insertion) {
    v_array<unsigned_int>::push_back(&(b->nodes)._begin[local_a8].examples_index,local_80);
    pnVar2 = (b->nodes)._begin;
    if ((b->max_leaf_examples <=
         (ulong)((long)pnVar2[local_a8].examples_index._end -
                 (long)pnVar2[local_a8].examples_index._begin >> 2)) &&
       (((long)(b->nodes)._end - (long)pnVar2) / 0x48 + 2U < b->max_nodes)) {
      split_leaf(b,local_90,local_a8);
    }
  }
  return;
}

Assistant:

void route_to_leaf(memory_tree& b, single_learner& base, const uint32_t & ec_array_index, uint32_t cn, v_array<uint32_t>& path, bool insertion){
		example& ec = *b.examples[ec_array_index];
        
        MULTICLASS::label_t mc;
        uint32_t save_multi_pred = 0;
        MULTILABEL::labels multilabels;
        MULTILABEL::labels preds;
        if (b.oas == false){
            mc = ec.l.multi;
            save_multi_pred = ec.pred.multiclass;
        }
        else{
            multilabels = ec.l.multilabels;
            preds = ec.pred.multilabels;
        }

        path.clear();
	    ec.l.simple = {FLT_MAX, 1.0, 0.0};
		while(b.nodes[cn].internal != -1){
			path.push_back(cn);  //path stores node id from the root to the leaf
			base.predict(ec, b.nodes[cn].base_router);
			float prediction = ec.pred.scalar;
			if (insertion == false)
				cn = prediction < 0 ? b.nodes[cn].left : b.nodes[cn].right;
			else
			    cn = insert_descent(b.nodes[cn], prediction);
		}
		path.push_back(cn); //push back the leaf 
        
        if (b.oas == false){
            ec.l.multi = mc; 
            ec.pred.multiclass = save_multi_pred;
        }
        else{
            ec.pred.multilabels = preds;
            ec.l.multilabels = multilabels;
        }

        //cout<<"at route to leaf: "<<path.size()<<endl;
		if (insertion == true){
			b.nodes[cn].examples_index.push_back(ec_array_index);
			if ((b.nodes[cn].examples_index.size() >= b.max_leaf_examples) && (b.nodes.size() + 2 < b.max_nodes))
				split_leaf(b,base,cn);
		}
	}